

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O0

void show_keymap_menu(nh_bool readonly)

{
  wchar_t wVar1;
  nh_menuitem_conflict *items_00;
  nh_menuitem_conflict *pnVar2;
  int iVar3;
  bool bVar4;
  wchar_t local_6c;
  wchar_t local_54;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  nh_menuitem *items;
  wchar_t local_18;
  nh_bool need_init;
  wchar_t icount;
  wchar_t n;
  wchar_t i;
  nh_bool readonly_local;
  
  bVar4 = cmdcount == L'\0';
  if (bVar4) {
    load_keymap();
  }
  items_00 = (nh_menuitem_conflict *)malloc(((long)cmdcount + 0x26) * 0x10c);
  do {
    items_00->id = L'\0';
    items_00->role = MI_HEADING;
    items_00->accel = '\0';
    items_00->group_accel = '\0';
    items_00->selected = '\0';
    strcpy(items_00->caption,"Command\tDescription\tKey");
    local_18 = L'\x01';
    for (icount = L'\0'; (uint)icount < 0x22; icount = icount + L'\x01') {
      if (readonly == '\0') {
        local_54 = -(icount + L'\x01');
      }
      else {
        local_54 = L'\0';
      }
      add_keylist_command(builtin_commands + icount,(nh_menuitem *)(items_00 + local_18),local_54);
      local_18 = local_18 + L'\x01';
    }
    for (icount = L'\0'; icount < cmdcount; icount = icount + L'\x01') {
      if (readonly == '\0') {
        local_6c = icount + L'\x01';
      }
      else {
        local_6c = L'\0';
      }
      add_keylist_command(commandlist + icount,(nh_menuitem *)(items_00 + local_18),local_6c);
      local_18 = local_18 + L'\x01';
    }
    if (readonly == '\0') {
      iVar3 = local_18 + L'\x01';
      pnVar2 = items_00 + local_18;
      pnVar2->id = L'\0';
      pnVar2->role = MI_TEXT;
      pnVar2->accel = '\0';
      pnVar2->group_accel = '\0';
      pnVar2->selected = '\0';
      strcpy(pnVar2->caption,"");
      local_18 = local_18 + L'\x02';
      pnVar2 = items_00 + iVar3;
      pnVar2->id = L'\xffffd8f0';
      pnVar2->role = MI_NORMAL;
      pnVar2->accel = '!';
      pnVar2->group_accel = '\0';
      pnVar2->selected = '\0';
      strcpy(pnVar2->caption,"!!!\tReset all key bindings to built-in defaults\t!!!");
    }
    wVar1 = curses_display_menu_core
                      (items_00,local_18,"Keymap",(uint)(readonly == '\0'),(wchar_t *)0x0,L'\0',
                       L'\0',_COLS,_LINES,set_command_keys,'\0');
  } while (L'\0' < wVar1);
  free(items_00);
  write_keymap();
  if (bVar4) {
    free_keymap();
  }
  return;
}

Assistant:

void show_keymap_menu(nh_bool readonly)
{
    int i, n, icount;
    nh_bool need_init = !cmdcount;
    struct nh_menuitem *items;

    if (need_init)
	load_keymap();

    items = malloc(sizeof(struct nh_menuitem) *
                                 (ARRAY_SIZE(builtin_commands) + cmdcount + 4));
    
    do {
	set_menuitem(&items[0], 0, MI_HEADING, "Command\tDescription\tKey", 0, FALSE);
	icount = 1;
	/* add builtin commands */
	for (i = 0; i < ARRAY_SIZE(builtin_commands); i++) {
	    add_keylist_command(&builtin_commands[i], &items[icount],
				readonly ? 0 : -(i+1));
	    icount++;
	}
	
	/* add in-game commands */
	for (i = 0; i < cmdcount; i++) {
	    add_keylist_command(&commandlist[i], &items[icount],
				readonly ? 0 : (i+1));
	    icount++;
	}
	
	if (!readonly) {
	    set_menuitem(&items[icount++], 0, MI_TEXT, "", 0, FALSE);
	    set_menuitem(&items[icount++], RESET_BINDINGS_ID, MI_NORMAL,
			"!!!\tReset all key bindings to built-in defaults\t!!!", '!', FALSE);
	}
	n = curses_display_menu_core(items, icount, "Keymap", readonly ? PICK_NONE :
				     PICK_ONE, NULL, 0, 0, COLS, LINES,
				     set_command_keys, FALSE);
    } while(n > 0);
    free(items);
    
    write_keymap();

    if (need_init)
	free_keymap();
}